

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToJUnit.cpp
# Opt level: O3

TestCaseResultPtr __thiscall
ResultToJUnitHandler::startTestCaseResult(ResultToJUnitHandler *this,char *casePath)

{
  TestCaseResultData *this_00;
  Writer *pWVar1;
  char *in_RDX;
  SharedPtrStateBase *extraout_RDX;
  TestCaseResultPtr TVar2;
  
  this_00 = (TestCaseResultData *)operator_new(0x60);
  xe::TestCaseResultData::TestCaseResultData(this_00,in_RDX);
  this->m_writer = (Writer *)0x0;
  (this->super_TestLogHandler)._vptr_TestLogHandler = (_func_int **)this_00;
  pWVar1 = (Writer *)operator_new(0x20);
  *(undefined4 *)&pWVar1->m_dataBuf = 0;
  *(undefined4 *)&(pWVar1->m_dataBuf).field_0x4 = 0;
  pWVar1->m_rawDst = (ostream *)&PTR__SharedPtrState_0011bf18;
  *(TestCaseResultData **)&(pWVar1->m_dataBuf).field_0x8 = this_00;
  this->m_writer = pWVar1;
  *(undefined4 *)&pWVar1->m_dataBuf = 1;
  *(undefined4 *)&(pWVar1->m_dataBuf).field_0x4 = 1;
  TVar2.m_state = extraout_RDX;
  TVar2.m_ptr = (TestCaseResultData *)this;
  return TVar2;
}

Assistant:

xe::TestCaseResultPtr startTestCaseResult (const char* casePath)
	{
		return xe::TestCaseResultPtr(new xe::TestCaseResultData(casePath));
	}